

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::mutable_options(FileDescriptorProto *this)

{
  FileOptions *this_00;
  FileDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (FileOptions *)0x0) {
    this_00 = (FileOptions *)operator_new(0xb0);
    FileOptions::FileOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::FileOptions* FileDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) {
    options_ = new ::google::protobuf::FileOptions;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.FileDescriptorProto.options)
  return options_;
}